

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O0

void __thiscall
Lib::CombinationIterator<unsigned_int>::moveToNext(CombinationIterator<unsigned_int> *this)

{
  CombinationIterator<unsigned_int> *this_local;
  
  this->_second = this->_second + 1;
  if (this->_second == this->_afterLast) {
    this->_first = this->_first + 1;
    this->_second = this->_first;
    this->_second = this->_second + 1;
  }
  return;
}

Assistant:

void moveToNext()
  {
    _second++;
    ASS_LE(_second,_afterLast);
    if(_second==_afterLast) {
      _first++;
      _second=_first;
      _second++;
      //now, if _second==_afterLast, there's no combination left
    }
  }